

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O0

int Kit_GraphToGiaInternal(Gia_Man_t *pMan,Kit_Graph_t *pGraph,int fHash)

{
  int iVar1;
  int iVar2;
  Kit_Node_t *pKVar3;
  int pAnd1;
  int pAnd0;
  int i;
  Kit_Node_t *pNode;
  int fHash_local;
  Kit_Graph_t *pGraph_local;
  Gia_Man_t *pMan_local;
  
  _pAnd0 = (Kit_Node_t *)0x0;
  iVar1 = Kit_GraphIsConst(pGraph);
  if (iVar1 == 0) {
    iVar1 = Kit_GraphIsVar(pGraph);
    if (iVar1 == 0) {
      for (pAnd1 = pGraph->nLeaves; pAnd1 < pGraph->nSize; pAnd1 = pAnd1 + 1) {
        _pAnd0 = Kit_GraphNode(pGraph,pAnd1);
        pKVar3 = Kit_GraphNode(pGraph,(uint)_pAnd0->eEdge0 >> 1 & 0x3fffffff);
        iVar1 = Abc_LitNotCond((pKVar3->field_2).iFunc,(uint)_pAnd0->eEdge0 & 1);
        pKVar3 = Kit_GraphNode(pGraph,(uint)_pAnd0->eEdge1 >> 1 & 0x3fffffff);
        iVar2 = Abc_LitNotCond((pKVar3->field_2).iFunc,(uint)_pAnd0->eEdge1 & 1);
        if (fHash == 0) {
          iVar1 = Gia_ManAppendAnd2(pMan,iVar1,iVar2);
          (_pAnd0->field_2).iFunc = iVar1;
        }
        else {
          iVar1 = Gia_ManHashAnd(pMan,iVar1,iVar2);
          (_pAnd0->field_2).iFunc = iVar1;
        }
      }
      iVar1 = (_pAnd0->field_2).iFunc;
      iVar2 = Kit_GraphIsComplement(pGraph);
      pMan_local._4_4_ = Abc_LitNotCond(iVar1,iVar2);
    }
    else {
      pKVar3 = Kit_GraphVar(pGraph);
      iVar1 = (pKVar3->field_2).iFunc;
      iVar2 = Kit_GraphIsComplement(pGraph);
      pMan_local._4_4_ = Abc_LitNotCond(iVar1,iVar2);
    }
  }
  else {
    iVar1 = Kit_GraphIsComplement(pGraph);
    pMan_local._4_4_ = Abc_LitNotCond(1,iVar1);
  }
  return pMan_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Transforms the decomposition graph into the AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Kit_GraphToGiaInternal( Gia_Man_t * pMan, Kit_Graph_t * pGraph, int fHash )
{
    Kit_Node_t * pNode = NULL;
    int i, pAnd0, pAnd1;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Abc_LitNotCond( 1, Kit_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Abc_LitNotCond( Kit_GraphVar(pGraph)->iFunc, Kit_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Abc_LitNotCond( Kit_GraphNode(pGraph, pNode->eEdge0.Node)->iFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Abc_LitNotCond( Kit_GraphNode(pGraph, pNode->eEdge1.Node)->iFunc, pNode->eEdge1.fCompl ); 
        if ( fHash )
            pNode->iFunc = Gia_ManHashAnd( pMan, pAnd0, pAnd1 );
        else
            pNode->iFunc = Gia_ManAppendAnd2( pMan, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Abc_LitNotCond( pNode->iFunc, Kit_GraphIsComplement(pGraph) );
}